

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O3

void __thiscall QAutoPointer<QFontDialog>::~QAutoPointer(QAutoPointer<QFontDialog> *this)

{
  QObject *pQVar1;
  Data *pDVar2;
  
  pDVar2 = (this->o).wp.d;
  if (pDVar2 != (Data *)0x0) {
    if ((*(int *)(pDVar2 + 4) != 0) && (pQVar1 = (this->o).wp.value, pQVar1 != (QObject *)0x0)) {
      (**(code **)(*(long *)pQVar1 + 0x20))();
      pDVar2 = (this->o).wp.d;
      if (pDVar2 == (Data *)0x0) {
        return;
      }
    }
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      pDVar2 = (this->o).wp.d;
      if (pDVar2 == (Data *)0x0) {
        pDVar2 = (Data *)0x0;
      }
      operator_delete(pDVar2);
      return;
    }
  }
  return;
}

Assistant:

inline T *internalData() const noexcept
    {
        return d == nullptr || d->strongref.loadRelaxed() == 0 ? nullptr : value;
    }